

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

MIR_reg_t vn_add_val(MIR_context_t ctx,MIR_func_t func,MIR_type_t type,MIR_insn_code_t code,
                    MIR_op_t op1,MIR_op_t op2)

{
  val_t el;
  val_t el_00;
  int iVar1;
  MIR_reg_t *pMVar2;
  val_t val;
  val_t tab_val;
  undefined8 uStack_110;
  MIR_reg_t MStack_a8;
  undefined4 uStack_a4;
  undefined8 uStack_a0;
  val_t local_98;
  
  el.type = type;
  el.code = code;
  el._116_4_ = uStack_a4;
  el.reg = MStack_a8;
  el._8_8_ = uStack_110;
  el.op1.data = op1.data;
  el.op1._8_8_ = op1._8_8_;
  el.op1.u.i = op1.u.i;
  el.op1.u.str.s = op1.u.str.s;
  el.op1.u._16_8_ = op1.u._16_8_;
  el.op1.u.mem.disp = op1.u.mem.disp;
  el.op2.data = op2.data;
  el.op2._8_8_ = op2._8_8_;
  el.op2.u.i = op2.u.i;
  el.op2.u.str.s = op2.u.str.s;
  el.op2.u._16_8_ = op2.u._16_8_;
  el.op2.u.mem.disp = op2.u.mem.disp;
  el._120_8_ = uStack_a0;
  iVar1 = HTAB_val_t_do(ctx->simplify_ctx->val_tab,el,HTAB_FIND,&local_98);
  if (iVar1 == 0) {
    MStack_a8 = new_temp_reg(ctx,type,func);
    pMVar2 = &MStack_a8;
    el_00.type = type;
    el_00.code = code;
    el_00._116_4_ = uStack_a4;
    el_00.reg = MStack_a8;
    el_00._8_8_ = uStack_110;
    el_00.op1.data = op1.data;
    el_00.op1._8_8_ = op1._8_8_;
    el_00.op1.u.i = op1.u.i;
    el_00.op1.u.str.s = op1.u.str.s;
    el_00.op1.u._16_8_ = op1.u._16_8_;
    el_00.op1.u.mem.disp = op1.u.mem.disp;
    el_00.op2.data = op2.data;
    el_00.op2._8_8_ = op2._8_8_;
    el_00.op2.u.i = op2.u.i;
    el_00.op2.u.str.s = op2.u.str.s;
    el_00.op2.u._16_8_ = op2.u._16_8_;
    el_00.op2.u.mem.disp = op2.u.mem.disp;
    el_00._120_8_ = uStack_a0;
    HTAB_val_t_do(ctx->simplify_ctx->val_tab,el_00,HTAB_INSERT,&local_98);
  }
  else {
    pMVar2 = &local_98.reg;
  }
  return *pMVar2;
}

Assistant:

static MIR_reg_t vn_add_val (MIR_context_t ctx, MIR_func_t func, MIR_type_t type,
                             MIR_insn_code_t code, MIR_op_t op1, MIR_op_t op2) {
  val_t val, tab_val;

  val.type = type;
  val.code = code;
  val.op1 = op1;
  val.op2 = op2;
  if (HTAB_DO (val_t, val_tab, val, HTAB_FIND, tab_val)) return tab_val.reg;
  val.reg = new_temp_reg (ctx, type, func);
  HTAB_DO (val_t, val_tab, val, HTAB_INSERT, tab_val);
  return val.reg;
}